

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O3

void server::initCmds(void)

{
  QServ::newcommand(&qs,"help",
                    "\f7View command list or command usage. \nUsage: #help for command list and #help <name-of-command> for usage"
                    ,0,help_cmd,1);
  QServ::newcommand(&qs,"me","\f7Echo your name and message to everyone. Usage: #me <message>",0,
                    me_cmd,0);
  QServ::newcommand(&qs,"stats",
                    "\f7View the stats of a player or yourself. Usage: #stats <cn> or #stats",0,
                    stats_cmd,1);
  QServ::newcommand(&qs,"localtime","\f7Get the local time of the server. Usage: #localtime",3,
                    localtime_cmd,0);
  QServ::newcommand(&qs,"ver","\f7Get the current QServ version. Usage: #ver",0,getversion_cmd,0);
  QServ::newcommand(&qs,"uptime","\f7View how long the server has been up for. Usage: #uptime",0,
                    uptime_cmd,0);
  QServ::newcommand(&qs,"invadmin","\f7Claim invisible administrator. Usage: #invadmin <adminpass>",
                    0,invadmin_cmd,1);
  QServ::newcommand(&qs,"cheater",
                    "\f7Accuses someone of cheating and alerts moderators. Usage: #cheater <cn>",0,
                    cheater_cmd,1);
  QServ::newcommand(&qs,"whois","\f7View information about a player. Usage: #whois <cn>",0,whois_cmd
                    ,1);
  QServ::newcommand(&qs,"time","\f7View the current time. Usage: #time <UTC Offset Number>",1,
                    time_cmd,1);
  QServ::newcommand(&qs,"pm",
                    "\f7Send a private message to someone. Usage #pm <cn> <private message>",0,
                    pm_cmd,2);
  QServ::newcommand(&qs,"callops",
                    "\f7Call all operators on the Internet Relay Chat Server. Usage: #callops",0,
                    callops_cmd,0);
  QServ::newcommand(&qs,"mapsucks",
                    "\f7Votes for an intermission to change the map. Usage: #mapsucks",0,
                    mapsucks_cmd,0);
  QServ::newcommand(&qs,"forgive",
                    "\f7Forgive a player for teamkilling or just in general. Usage: #forgive <cn>",0
                    ,forgive_cmd,1);
  QServ::newcommand(&qs,"intermission","\f7Force an intermission. Usage: #intermission",1,
                    forceintermission_cmd,0);
  QServ::newcommand(&qs,"echo","\f7Broadcast a message to all players. Usage: #echo <message>",1,
                    echo_cmd,1);
  QServ::newcommand(&qs,"sendprivs",
                    "\f7Share master/admin with another player. Usage: #sendprivs <cn>",1,
                    sendprivs_cmd,1);
  QServ::newcommand(&qs,"bunny",
                    "\f7Broadcast a helper message to all players. Usage: #bunny <helpmessage>",3,
                    bunny_cmd,0);
  QServ::newcommand(&qs,"revokepriv","\f7Revoke the privileges of a player. Usage: #revokepriv <cn>"
                    ,3,revokepriv_cmd,1);
  QServ::newcommand(&qs,"forcespectator",
                    "\f7Forces a player to become a spectator. Usage: #forcespectator <cn>",3,
                    forcespectator_cmd,1);
  QServ::newcommand(&qs,"unspectate",
                    "\f7Removes a player from spectator mode. Usage: #unspectate <cn>",3,
                    unspectate_cmd,1);
  QServ::newcommand(&qs,"mute","\f7Mutes a client. Usage #mute <cn>",3,mute_cmd,1);
  QServ::newcommand(&qs,"unmute","\f7Unmutes a client. Usage #mute <cn>",3,unmute_cmd,1);
  QServ::newcommand(&qs,"editmute","\f7Stops a client from editing. Usage #editmute <cn>",3,
                    editmute_cmd,1);
  QServ::newcommand(&qs,"uneditmute","\f7Allows a client to edit again. Usage #uneditmute <cn>",3,
                    uneditmute_cmd,1);
  QServ::newcommand(&qs,"togglelockspec",
                    "\f7Forces a client to be locked in spectator mode. Usage #togglelockspec <cn>",
                    3,togglelockspec_cmd,1);
  QServ::newcommand(&qs,"ban","\f7Bans a client. Usage: #ban <cn> <ban time in minutes>",3,ban_cmd,2
                   );
  QServ::newcommand(&qs,"pban",
                    "\f7Permanently bans a client. Not listed on #listbans. Use #clearbans to clear all. Usage: #pban <cn>"
                    ,3,pban_cmd,1);
  QServ::newcommand(&qs,"clearbans","\f7Clears all bans and pbans. Usage: #clearpbans",3,
                    clearpbans_cmd,0);
  QServ::newcommand(&qs,"teampersist",
                    "\f7Toggle persistant teams on or off. Usage: #teampersist <0/1> (0 for off, 1 for on)"
                    ,1,teampersist_cmd,1);
  QServ::newcommand(&qs,"allowmaster",
                    "\f7Allows clients to claim master. Usage: #allowmaster <0/1> (0 for off, 1 for on)"
                    ,3,allowmaster_cmd,1);
  QServ::newcommand(&qs,"kill","\f7Brutally murders a player. Usage: #kill <cn>",3,kill_cmd,1);
  QServ::newcommand(&qs,"rename","\f7Renames a player. Usage: #rename <cn> <new name>",3,rename_cmd,
                    2);
  QServ::newcommand(&qs,"addkey",
                    "\f7Adds an authkey to the server. \nUsage: #addkey <name> <domain> <public key> <privilege>"
                    ,3,addkey_cmd,4);
  QServ::newcommand(&qs,"listbans","\f7Lists all bans. Usage: #listbans",3,listbans_cmd,0);
  QServ::newcommand(&qs,"reloadconfig",
                    "\f7Reloads server-init.cfg configuration. Usage: #reloadconfig",3,
                    reloadconfig_cmd,0);
  QServ::newcommand(&qs,"unban",
                    "\f7Unbans a player. Usage: #unban <ID>. Use #listbans for a list with ID\'s",3,
                    unkickban_cmd,1);
  QServ::newcommand(&qs,"syncauth",
                    "\f7Sync server with new authkeys added to users.cfg. Usage: #syncauth",3,
                    syncauth_cmd,0);
  QServ::newcommand(&qs,"cw",
                    "\f7Starts a clanwar with a countdown (timer dependent on maxclients). Usage: #cw <mode> <map>"
                    ,1,cw_cmd,2);
  QServ::newcommand(&qs,"duel",
                    "\f7Starts a duel (timer dependent on maxclients). Usage: #duel <mode> <map>",1,
                    duel_cmd,2);
  QServ::newcommand(&qs,"icgl",
                    "\f7Sets the game limit in milliseconds for instacoop. Usage: #icgl <limit in milliseconds>"
                    ,3,coopgamelimit_cmd,1);
  QServ::newcommand(&qs,"listmaps","\f7Lists all the maps stored on the server. Usage #listmaps",3,
                    listmaps_cmd,0);
  QServ::newcommand(&qs,"savemap","\f7Saves a map to the server. Usage #savemap",3,savemap_cmd,0);
  QServ::newcommand(&qs,"autosendmap",
                    "\f7Automatically sends the map to connecting clients. Usage #autosendmap <1/0> (0 for off, 1 for on)"
                    ,1,autosendmap_cmd,1);
  QServ::newcommand(&qs,"loadmap","\f7Loads a map stored on the server. Usage #loadmap <mapname>",3,
                    loadmap_cmd,1);
  return;
}

Assistant:

void initCmds() {
        /**
            @ncommand = New Command
            @Command name
            @Command description and usage
            @Command callback function
            @Command argument count
        **/
        ncommand("help", "\f7View command list or command usage. \nUsage: #help for command list and #help <name-of-command> for usage", PRIV_NONE, help_cmd, 1);
        ncommand("me", "\f7Echo your name and message to everyone. Usage: #me <message>", PRIV_NONE, me_cmd, 0);
        ncommand("stats", "\f7View the stats of a player or yourself. Usage: #stats <cn> or #stats", PRIV_NONE, stats_cmd, 1);
        ncommand("localtime", "\f7Get the local time of the server. Usage: #localtime", PRIV_ADMIN, localtime_cmd, 0);
        ncommand("ver", "\f7Get the current QServ version. Usage: #ver", PRIV_NONE, getversion_cmd, 0);
        ncommand("uptime", "\f7View how long the server has been up for. Usage: #uptime", PRIV_NONE, uptime_cmd, 0);
        ncommand("invadmin", "\f7Claim invisible administrator. Usage: #invadmin <adminpass>", PRIV_NONE, invadmin_cmd, 1);
        ncommand("cheater", "\f7Accuses someone of cheating and alerts moderators. Usage: #cheater <cn>", PRIV_NONE, cheater_cmd, 1);
        ncommand("whois", "\f7View information about a player. Usage: #whois <cn>", PRIV_NONE, whois_cmd, 1);
        ncommand("time", "\f7View the current time. Usage: #time <UTC Offset Number>", PRIV_MASTER, time_cmd, 1);
        ncommand("pm", "\f7Send a private message to someone. Usage #pm <cn> <private message>", PRIV_NONE, pm_cmd,2);
        ncommand("callops", "\f7Call all operators on the Internet Relay Chat Server. Usage: #callops", PRIV_NONE, callops_cmd, 0);
        ncommand("mapsucks", "\f7Votes for an intermission to change the map. Usage: #mapsucks", PRIV_NONE, mapsucks_cmd, 0);
        ncommand("forgive", "\f7Forgive a player for teamkilling or just in general. Usage: #forgive <cn>", PRIV_NONE, forgive_cmd, 1);
        ncommand("intermission", "\f7Force an intermission. Usage: #intermission", PRIV_MASTER, forceintermission_cmd, 0);
        ncommand("echo", "\f7Broadcast a message to all players. Usage: #echo <message>", PRIV_MASTER, echo_cmd, 1);
        ncommand("sendprivs", "\f7Share master/admin with another player. Usage: #sendprivs <cn>", PRIV_MASTER, sendprivs_cmd, 1);
        ncommand("bunny", "\f7Broadcast a helper message to all players. Usage: #bunny <helpmessage>", PRIV_ADMIN, bunny_cmd, 0);
        ncommand("revokepriv", "\f7Revoke the privileges of a player. Usage: #revokepriv <cn>", PRIV_ADMIN, revokepriv_cmd, 1);
        ncommand("forcespectator", "\f7Forces a player to become a spectator. Usage: #forcespectator <cn>", PRIV_ADMIN, forcespectator_cmd, 1);
        ncommand("unspectate", "\f7Removes a player from spectator mode. Usage: #unspectate <cn>", PRIV_ADMIN, unspectate_cmd, 1);
        ncommand("mute", "\f7Mutes a client. Usage #mute <cn>", PRIV_ADMIN, mute_cmd, 1);
        ncommand("unmute", "\f7Unmutes a client. Usage #mute <cn>", PRIV_ADMIN, unmute_cmd, 1);
        ncommand("editmute", "\f7Stops a client from editing. Usage #editmute <cn>", PRIV_ADMIN, editmute_cmd, 1);
        ncommand("uneditmute", "\f7Allows a client to edit again. Usage #uneditmute <cn>", PRIV_ADMIN, uneditmute_cmd, 1);
        ncommand("togglelockspec", "\f7Forces a client to be locked in spectator mode. Usage #togglelockspec <cn>", PRIV_ADMIN, togglelockspec_cmd, 1);
        ncommand("ban", "\f7Bans a client. Usage: #ban <cn> <ban time in minutes>", PRIV_ADMIN, ban_cmd, 2);
        ncommand("pban", "\f7Permanently bans a client. Not listed on #listbans. Use #clearbans to clear all. Usage: #pban <cn>", PRIV_ADMIN, pban_cmd, 1);
        ncommand("clearbans", "\f7Clears all bans and pbans. Usage: #clearpbans", PRIV_ADMIN, clearpbans_cmd, 0);
        ncommand("teampersist", "\f7Toggle persistant teams on or off. Usage: #teampersist <0/1> (0 for off, 1 for on)", PRIV_MASTER, teampersist_cmd, 1);
        ncommand("allowmaster", "\f7Allows clients to claim master. Usage: #allowmaster <0/1> (0 for off, 1 for on)", PRIV_ADMIN, allowmaster_cmd, 1);
        ncommand("kill", "\f7Brutally murders a player. Usage: #kill <cn>", PRIV_ADMIN, kill_cmd, 1);
        ncommand("rename", "\f7Renames a player. Usage: #rename <cn> <new name>", PRIV_ADMIN, rename_cmd, 2);
        ncommand("addkey", "\f7Adds an authkey to the server. \nUsage: #addkey <name> <domain> <public key> <privilege>", PRIV_ADMIN, addkey_cmd, 4);
        ncommand("listbans", "\f7Lists all bans. Usage: #listbans", PRIV_ADMIN, listbans_cmd, 0);
        ncommand("reloadconfig","\f7Reloads server-init.cfg configuration. Usage: #reloadconfig", PRIV_ADMIN, reloadconfig_cmd, 0);
        ncommand("unban", "\f7Unbans a player. Usage: #unban <ID>. Use #listbans for a list with ID's", PRIV_ADMIN, unkickban_cmd, 1);
        ncommand("syncauth", "\f7Sync server with new authkeys added to users.cfg. Usage: #syncauth", PRIV_ADMIN, syncauth_cmd, 0);
        ncommand("cw", "\f7Starts a clanwar with a countdown (timer dependent on maxclients). Usage: #cw <mode> <map>", PRIV_MASTER, cw_cmd, 2);
        ncommand("duel", "\f7Starts a duel (timer dependent on maxclients). Usage: #duel <mode> <map>", PRIV_MASTER, duel_cmd, 2);
        ncommand("icgl", "\f7Sets the game limit in milliseconds for instacoop. Usage: #icgl <limit in milliseconds>", PRIV_ADMIN, coopgamelimit_cmd, 1);
        ncommand("listmaps", "\f7Lists all the maps stored on the server. Usage #listmaps", PRIV_ADMIN, listmaps_cmd, 0);
        ncommand("savemap", "\f7Saves a map to the server. Usage #savemap", PRIV_ADMIN, savemap_cmd, 0);
        ncommand("autosendmap", "\f7Automatically sends the map to connecting clients. Usage #autosendmap <1/0> (0 for off, 1 for on)", PRIV_MASTER, autosendmap_cmd, 1);
        ncommand("loadmap", "\f7Loads a map stored on the server. Usage #loadmap <mapname>", PRIV_ADMIN, loadmap_cmd, 1);
        //ncommand("smartbot", "\f7Speak to smart IRC bot. Usage: #smartbot <command> \nUse: #smartbot help for a list of commands", PRIV_NONE, smartbot_cmd, 1);
        //ncommand("owords", "View list of offensive words. Usage: #owords",PRIV_NONE, owords_cmd, 0);
        //ncommand("olangfilter", "Turn the offensive language filter on or off. Usage: #olang <off/on> (0/1) and #olang to see if it's activated", PRIV_MASTER, olangfilter_cmd, 1);
    }